

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathVector3.h
# Opt level: O2

Vector3 * __thiscall COLLADABU::Math::Vector3::crossProduct(Vector3 *this,Vector3 *rkVector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3 *kCross;
  Vector3 *in_RDI;
  
  dVar1 = (rkVector->field_0).field_0.x;
  dVar2 = (this->field_0).field_0.x;
  dVar3 = (this->field_0).field_0.y;
  dVar4 = (this->field_0).field_0.z;
  dVar5 = (rkVector->field_0).field_0.y;
  dVar6 = (rkVector->field_0).field_0.z;
  (in_RDI->field_0).field_0.x = dVar6 * dVar3 - dVar4 * dVar5;
  (in_RDI->field_0).field_0.y = dVar1 * dVar4 - dVar2 * dVar6;
  (in_RDI->field_0).field_0.z = dVar2 * dVar5 - dVar1 * dVar3;
  return in_RDI;
}

Assistant:

inline Vector3 crossProduct( const Vector3& rkVector ) const
            {
                Vector3 kCross;

                kCross.x = y * rkVector.z - z * rkVector.y;
                kCross.y = z * rkVector.x - x * rkVector.z;
                kCross.z = x * rkVector.y - y * rkVector.x;

                return kCross;
            }